

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void __thiscall Engine::toggleVSIDS(Engine *this)

{
  uint uVar1;
  uint uVar2;
  long in_RDI;
  uint i_1;
  vec<Branching_*> old_x_1;
  uint i;
  vec<Branching_*> old_x;
  vec<Branching_*> *in_stack_ffffffffffffff78;
  long *plVar3;
  vec<Branching_*> *in_stack_ffffffffffffff80;
  long *in_stack_ffffffffffffff98;
  int iVar4;
  Tint *in_stack_ffffffffffffffa0;
  uint local_3c;
  vec<Branching_*> local_38;
  uint local_28;
  vec<Branching_*> local_18;
  
  if (so.vsids) {
    vec<Branching_*>::vec(&local_38);
    vec<Branching_*>::moveTo(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    local_3c = 1;
    while( true ) {
      uVar2 = vec<Branching_*>::size(&local_38);
      iVar4 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
      if (uVar2 <= local_3c) break;
      plVar3 = *(long **)(in_RDI + 0x70);
      in_stack_ffffffffffffff80 =
           (vec<Branching_*> *)vec<Branching_*>::operator[](&local_38,local_3c);
      (**(code **)(*plVar3 + 0x18))(plVar3,*(Branching **)in_stack_ffffffffffffff80);
      local_3c = local_3c + 1;
    }
    Tint::operator=(in_stack_ffffffffffffffa0,iVar4);
    Tint::operator=(in_stack_ffffffffffffffa0,iVar4);
    so.vsids = false;
    vec<Branching_*>::~vec(in_stack_ffffffffffffff80);
  }
  else {
    vec<Branching_*>::vec(&local_18);
    vec<Branching_*>::moveTo(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    (**(code **)(**(long **)(in_RDI + 0x70) + 0x18))(*(long **)(in_RDI + 0x70),&sat);
    local_28 = 0;
    while( true ) {
      uVar2 = local_28;
      iVar4 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
      uVar1 = vec<Branching_*>::size(&local_18);
      if (uVar1 <= uVar2) break;
      in_stack_ffffffffffffff98 = *(long **)(in_RDI + 0x70);
      in_stack_ffffffffffffffa0 = (Tint *)vec<Branching_*>::operator[](&local_18,local_28);
      (**(code **)(*in_stack_ffffffffffffff98 + 0x18))
                (in_stack_ffffffffffffff98,*(Branching **)in_stack_ffffffffffffffa0);
      local_28 = local_28 + 1;
    }
    Tint::operator=(in_stack_ffffffffffffffa0,iVar4);
    Tint::operator=(in_stack_ffffffffffffffa0,iVar4);
    so.vsids = true;
    vec<Branching_*>::~vec(in_stack_ffffffffffffff80);
  }
  return;
}

Assistant:

void Engine::toggleVSIDS() const {
	if (!so.vsids) {
		vec<Branching*> old_x;
		branching->x.moveTo(old_x);
		branching->add(&sat);
		for (unsigned int i = 0; i < old_x.size(); i++) {
			branching->add(old_x[i]);
		}
		branching->fin = 0;
		branching->cur = -1;
		so.vsids = true;
	} else {
		vec<Branching*> old_x;
		branching->x.moveTo(old_x);
		for (unsigned int i = 1; i < old_x.size(); i++) {
			branching->add(old_x[i]);
		}
		branching->fin = 0;
		branching->cur = -1;
		so.vsids = false;
	}
}